

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createLightSource_infinite(SemanticParser *this,SP *in)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  int iVar9;
  _Rb_tree_node_base *p_Var10;
  ostream *poVar11;
  runtime_error *this_00;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vec3f *result;
  SP SVar12;
  SP light;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  
  std::make_shared<pbrt::InfiniteLightSource>();
  lVar1 = *in_RDX;
  uVar2 = *(undefined8 *)(lVar1 + 0x58);
  uVar3 = *(undefined8 *)(lVar1 + 0x60);
  uVar4 = *(undefined8 *)(lVar1 + 0x68);
  uVar5 = *(undefined8 *)(lVar1 + 0x70);
  uVar6 = *(undefined8 *)(lVar1 + 0x80);
  *(undefined8 *)
   &((light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    transform).l.vz.z = *(undefined8 *)(lVar1 + 0x78);
  ((light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).p.y = (float)(int)uVar6;
  ((light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).p.z = (float)(int)((ulong)uVar6 >> 0x20);
  ((light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vy.y = (float)(int)uVar4;
  ((light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vy.z = (float)(int)((ulong)uVar4 >> 0x20);
  ((light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vz.x = (float)(int)uVar5;
  ((light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vz.y = (float)(int)((ulong)uVar5 >> 0x20);
  ((light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vx.x = (float)(int)uVar2;
  ((light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  transform).l.vx.y = (float)(int)((ulong)uVar2 >> 0x20);
  *(undefined8 *)
   &((light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    transform).l.vx.z = uVar3;
  lVar1 = *in_RDX;
  p_Var10 = *(_Rb_tree_node_base **)(lVar1 + 0x20);
  do {
    if (p_Var10 == (_Rb_tree_node_base *)(lVar1 + 0x10)) {
      poVar11 = std::operator<<((ostream *)&std::cout,"found infinite light source w/ map ");
      poVar11 = std::operator<<(poVar11,(string *)
                                        &(light.
                                          super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->mapName);
      std::endl<char,std::char_traits<char>>(poVar11);
      _Var7 = light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var7._M_pi;
      light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      SVar12.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar12.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (SP)SVar12.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)(p_Var10 + 1));
    std::__cxx11::string::string((string *)&name,(string *)&it);
    bVar8 = std::operator==(&name,"mapname");
    if (bVar8) {
      syntactic::ParamSet::getParamString(&local_c0,(ParamSet *)(*in_RDX + 8),&name);
      std::__cxx11::string::operator=
                ((string *)
                 &(light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->mapName,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    else {
      bVar8 = std::operator==(&name,"L");
      if (bVar8) {
        result = &(light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->L;
      }
      else {
        bVar8 = std::operator==(&name,"scale");
        if (!bVar8) {
          bVar8 = std::operator==(&name,"nsamples");
          if (!bVar8) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_a0,"unknown \'infinite\' light source param \'",&name);
            std::operator+(&local_c0,&local_a0,"\'");
            std::runtime_error::runtime_error(this_00,(string *)&local_c0);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar9 = syntactic::ParamSet::getParam1i
                            ((ParamSet *)(*in_RDX + 8),&name,
                             (light.
                              super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->nSamples);
          (light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          nSamples = iVar9;
          goto LAB_00138131;
        }
        result = &(light.super___shared_ptr<pbrt::InfiniteLightSource,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->scale;
      }
      syntactic::ParamSet::getParam3f((ParamSet *)(*in_RDX + 8),&result->x,&name);
    }
LAB_00138131:
    std::__cxx11::string::~string((string *)&name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(&it);
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
  } while( true );
}

Assistant:

LightSource::SP SemanticParser::createLightSource_infinite
  (pbrt::syntactic::LightSource::SP in)
  {
    InfiniteLightSource::SP light = std::make_shared<InfiniteLightSource>();
    // const std::string mapName = in->getParamString("mapname");
    // if (mapName == "")
    //   std::cerr << "warning: no 'mapname' in infinite lightsource!?" << std::endl;
    
    light->transform = in->transform.atStart;
    // light->mapName = mapName;

    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "mapname") {
        light->mapName = in->getParamString(name);
        continue;
      }
      if (name == "L") {
        in->getParam3f(&light->L.x,name);
        continue;
      }
      if (name == "scale") {
        in->getParam3f(&light->scale.x,name);
        continue;
      }
      if (name == "nsamples") {
        light->nSamples = in->getParam1i(name,light->nSamples);
        continue;
      }
      throw std::runtime_error("unknown 'infinite' light source param '"+name+"'");
    }

    std::cout << "found infinite light source w/ map " << light->mapName << std::endl;
    return light;
  }